

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

Vec_Ptr_t *
Abc_NodeCollectTfoCands(Abc_ManCut_t *p,Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,int LevelMax)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  uint local_58;
  int local_54;
  int LevelMin;
  int v;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vVec;
  Abc_Ntk_t *pNtk;
  int LevelMax_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pRoot_local;
  Abc_ManCut_t *p_local;
  
  pNtk_00 = pRoot->pNtk;
  iVar1 = Abc_NtkIsStrash(pNtk_00);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x2c1,
                  "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  for (v = 0; iVar1 = Vec_VecSize(p->vLevels), v < iVar1; v = v + 1) {
    pVVar2 = Vec_VecEntry(p->vLevels,v);
    if (pVVar2->nSize != 0) {
      __assert_fail("vVec->nSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                    ,0x2c5,
                    "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                   );
    }
  }
  Abc_NtkIncrementTravId(pNtk_00);
  local_58 = 0xffffffff;
  for (v = 0; iVar1 = Vec_PtrSize(vLeaves), v < iVar1; v = v + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vLeaves,v);
    if (*(uint *)&pAVar3->field_0x14 >> 0xc <= (uint)LevelMax) {
      Abc_NodeSetTravIdCurrent(pAVar3);
      Vec_VecPush(p->vLevels,*(uint *)&pAVar3->field_0x14 >> 0xc,pAVar3);
      if ((int)local_58 < (int)(*(uint *)&pAVar3->field_0x14 >> 0xc)) {
        local_58 = *(uint *)&pAVar3->field_0x14 >> 0xc;
      }
    }
  }
  if ((int)local_58 < 0) {
    __assert_fail("LevelMin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x2d3,
                  "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  if (pRoot != (Abc_Obj_t *)0x0) {
    Abc_NodeMffcLabelAig(pRoot);
  }
  Vec_PtrClear(p->vNodesTfo);
  v = local_58;
  do {
    iVar1 = Vec_VecSize(p->vLevels);
    if (iVar1 <= v) {
      for (v = local_58;
          (iVar1 = Vec_VecSize(p->vLevels), v < iVar1 &&
          (pVVar2 = Vec_VecEntry(p->vLevels,v), v <= LevelMax)); v = v + 1) {
        Vec_PtrClear(pVVar2);
      }
      return p->vNodesTfo;
    }
    LevelMin = 0;
    while( true ) {
      pVVar2 = Vec_VecEntry(p->vLevels,v);
      iVar1 = Vec_PtrSize(pVVar2);
      if (iVar1 <= LevelMin) break;
      pVVar2 = Vec_VecEntry(p->vLevels,v);
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2,LevelMin);
      if (LevelMax < v) break;
      iVar1 = Abc_NodeIsTravIdCurrent(pAVar3);
      if (iVar1 == 0) {
        pAVar4 = Abc_ObjFanin0(pAVar3);
        iVar1 = Abc_NodeIsTravIdCurrent(pAVar4);
        if (iVar1 != 0) {
          pAVar4 = Abc_ObjFanin1(pAVar3);
          iVar1 = Abc_NodeIsTravIdCurrent(pAVar4);
          if (iVar1 != 0) {
            Vec_PtrPush(p->vNodesTfo,pAVar3);
            Abc_NodeSetTravIdCurrent(pAVar3);
            goto LAB_0035eeae;
          }
        }
      }
      else {
LAB_0035eeae:
        for (local_54 = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), local_54 < iVar1;
            local_54 = local_54 + 1) {
          pAVar4 = Abc_ObjFanout(pAVar3,local_54);
          iVar1 = Abc_ObjIsCo(pAVar4);
          if (((iVar1 == 0) && (*(uint *)&pAVar4->field_0x14 >> 0xc <= (uint)LevelMax)) &&
             (iVar1 = Abc_NodeIsTravIdCurrent(pAVar4), iVar1 == 0)) {
            Vec_VecPushUnique(p->vLevels,*(uint *)&pAVar4->field_0x14 >> 0xc,pAVar4);
          }
        }
      }
      LevelMin = LevelMin + 1;
    }
    v = v + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abc_NodeCollectTfoCands( Abc_ManCut_t * p, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, int LevelMax )
{
    Abc_Ntk_t * pNtk = pRoot->pNtk;
    Vec_Ptr_t * vVec;
    Abc_Obj_t * pNode, * pFanout;
    int i, k, v, LevelMin;
    assert( Abc_NtkIsStrash(pNtk) );

    // assuming that the structure is clean
    Vec_VecForEachLevel( p->vLevels, vVec, i )
        assert( vVec->nSize == 0 );

    // put fanins into the structure while labeling them
    Abc_NtkIncrementTravId( pNtk );
    LevelMin = -1;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        if ( pNode->Level > (unsigned)LevelMax )
            continue;
        Abc_NodeSetTravIdCurrent( pNode );
        Vec_VecPush( p->vLevels, pNode->Level, pNode );
        if ( LevelMin < (int)pNode->Level )
            LevelMin = pNode->Level;
    }
    assert( LevelMin >= 0 );

    // mark MFFC 
    if ( pRoot )
        Abc_NodeMffcLabelAig( pRoot );

    // go through the levels up
    Vec_PtrClear( p->vNodesTfo );
    Vec_VecForEachEntryStart( Abc_Obj_t *, p->vLevels, pNode, i, k, LevelMin )
    {
        if ( i > LevelMax )
            break;
        // if the node is not marked, it is not a fanin
        if ( !Abc_NodeIsTravIdCurrent(pNode) )
        {
            // check if it belongs to the TFO
            if ( !Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pNode)) || 
                 !Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pNode)) )
                 continue;
            // save the node in the TFO and label it
            Vec_PtrPush( p->vNodesTfo, pNode );
            Abc_NodeSetTravIdCurrent( pNode );
        }
        // go through the fanouts and add them to the structure if they meet the conditions
        Abc_ObjForEachFanout( pNode, pFanout, v )
        {
            // skip if fanout is a CO or its level exceeds
            if ( Abc_ObjIsCo(pFanout) || pFanout->Level > (unsigned)LevelMax )
                continue;
            // skip if it is already added or if it is in MFFC
            if ( Abc_NodeIsTravIdCurrent(pFanout) )
                continue;
            // add it to the structure but do not mark it (until tested later)
            Vec_VecPushUnique( p->vLevels, pFanout->Level, pFanout );
        }
    }

    // clear the levelized structure
    Vec_VecForEachLevelStart( p->vLevels, vVec, i, LevelMin )
    {
        if ( i > LevelMax )
            break;
        Vec_PtrClear( vVec );
    }
    return p->vNodesTfo;
}